

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O2

int version_compare4(char *v1,char *v2,int v1_flags,int v2_flags)

{
  component_t *pcVar1;
  bool bVar2;
  char *pcVar3;
  undefined4 uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  component_t *pcVar8;
  component_t *pcVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  component_t v2_components [2];
  component_t v1_components [2];
  char *local_a8;
  char *local_a0;
  component_t local_98 [2];
  component_t local_68 [2];
  
  bVar16 = (v1_flags & 0xcU) != 0;
  bVar17 = (v2_flags & 0xcU) != 0;
  sVar7 = 0;
  sVar6 = 0;
  local_a8 = v2;
  local_a0 = v1;
  do {
    if (sVar6 == 0) {
      sVar6 = get_next_version_component(&local_a0,local_68,v1_flags);
    }
    if (sVar7 == 0) {
      sVar7 = get_next_version_component(&local_a8,local_98,v2_flags);
    }
    uVar14 = sVar7;
    if (sVar6 < sVar7) {
      uVar14 = sVar6;
    }
    lVar10 = uVar14 + 1;
    pcVar8 = local_98;
    pcVar9 = local_68;
    while (lVar10 = lVar10 + -1, lVar10 != 0) {
      iVar5 = compare_components(pcVar9,pcVar8);
      pcVar8 = pcVar8 + 1;
      pcVar9 = pcVar9 + 1;
      if (iVar5 != 0) {
        return iVar5;
      }
    }
    if (sVar6 != sVar7) {
      pcVar8 = local_98;
      pcVar9 = local_68;
      uVar12 = uVar14;
      while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
        pcVar9->end = pcVar9[uVar14].end;
        pcVar1 = pcVar9 + uVar14;
        uVar4 = *(undefined4 *)&pcVar1->field_0x4;
        pcVar3 = pcVar1->start;
        pcVar9->metaorder = pcVar1->metaorder;
        *(undefined4 *)&pcVar9->field_0x4 = uVar4;
        pcVar9->start = pcVar3;
        pcVar8->end = pcVar8[uVar14].end;
        pcVar1 = pcVar8 + uVar14;
        uVar4 = *(undefined4 *)&pcVar1->field_0x4;
        pcVar3 = pcVar1->start;
        pcVar8->metaorder = pcVar1->metaorder;
        *(undefined4 *)&pcVar8->field_0x4 = uVar4;
        pcVar8->start = pcVar3;
        pcVar9 = pcVar9 + 1;
        pcVar8 = pcVar8 + 1;
      }
    }
    sVar6 = sVar6 - uVar14;
    bVar11 = sVar6 == 0 && *local_a0 == '\0';
    sVar7 = sVar7 - uVar14;
    bVar15 = sVar7 == 0 && *local_a8 == '\0';
    bVar13 = bVar16 && bVar11;
    if (bVar16 && (sVar6 == 0 && *local_a0 == '\0')) {
      bVar16 = false;
    }
    bVar2 = bVar17 && bVar15;
    if (bVar17 && (sVar7 == 0 && *local_a8 == '\0')) {
      bVar17 = false;
    }
  } while ((bVar11 == bVar13) || (bVar15 == bVar2));
  return 0;
}

Assistant:

int version_compare4(const char* v1, const char* v2, int v1_flags, int v2_flags) {
	component_t v1_components[2], v2_components[2];
	size_t v1_len = 0, v2_len = 0;
	size_t shift, i;

	int v1_extra_components = (v1_flags & (VERSIONFLAG_LOWER_BOUND|VERSIONFLAG_UPPER_BOUND)) ? 1 : 0;
	int v2_extra_components = (v2_flags & (VERSIONFLAG_LOWER_BOUND|VERSIONFLAG_UPPER_BOUND)) ? 1 : 0;

	int v1_exhausted, v2_exhausted;

	int res;

	do {
		if (v1_len == 0)
			v1_len = get_next_version_component(&v1, v1_components, v1_flags);
		if (v2_len == 0)
			v2_len = get_next_version_component(&v2, v2_components, v2_flags);

		shift = MY_MIN(v1_len, v2_len);
		for (i = 0; i < shift; i++) {
			res = compare_components(&v1_components[i], &v2_components[i]);
			if (res != 0)
				return res;
		}

		if (v1_len != v2_len) {
			for (i = 0; i < shift; i++) {
				v1_components[i] = v1_components[i+shift];
				v2_components[i] = v2_components[i+shift];
			}
		}

		v1_len -= shift;
		v2_len -= shift;

		v1_exhausted = *v1 == '\0' && v1_len == 0;
		v2_exhausted = *v2 == '\0' && v2_len == 0;

		if (v1_exhausted && v1_extra_components > 0) {
			v1_extra_components--;
			v1_exhausted = 0;
		}
		if (v2_exhausted && v2_extra_components > 0) {
			v2_extra_components--;
			v2_exhausted = 0;
		}
	} while (!v1_exhausted || !v2_exhausted);

	return 0;
}